

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

void __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::BinaryReaderInterp
          (BinaryReaderInterp *this,ModuleDesc *module,Errors *errors,Features *features)

{
  Features *errors_00;
  ValidateOptions local_34;
  Features *local_28;
  Features *features_local;
  Errors *errors_local;
  ModuleDesc *module_local;
  BinaryReaderInterp *this_local;
  
  local_28 = features;
  features_local = (Features *)errors;
  errors_local = (Errors *)module;
  module_local = (ModuleDesc *)this;
  BinaryReaderNop::BinaryReaderNop(&this->super_BinaryReaderNop);
  errors_00 = features_local;
  (this->super_BinaryReaderNop).super_BinaryReaderDelegate._vptr_BinaryReaderDelegate =
       (_func_int **)&PTR__BinaryReaderInterp_00300de8;
  this->errors_ = (Errors *)features_local;
  this->module_ = (ModuleDesc *)errors_local;
  this->istream_ = (Istream *)(errors_local + 0xb);
  ValidateOptions::ValidateOptions(&local_34,local_28);
  SharedValidator::SharedValidator(&this->validator_,(Errors *)errors_00,&local_34);
  std::
  vector<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
  ::vector(&this->label_stack_);
  FixupMap::FixupMap(&this->depth_fixups_);
  FixupMap::FixupMap(&this->func_fixups_);
  std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::vector
            (&this->func_types_);
  std::vector<wabt::interp::TableType,_std::allocator<wabt::interp::TableType>_>::vector
            (&this->table_types_);
  std::vector<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>::vector
            (&this->memory_types_);
  std::vector<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>::vector
            (&this->global_types_);
  std::vector<wabt::interp::EventType,_std::allocator<wabt::interp::EventType>_>::vector
            (&this->event_types_);
  return;
}

Assistant:

BinaryReaderInterp::BinaryReaderInterp(ModuleDesc* module,
                                       Errors* errors,
                                       const Features& features)
    : errors_(errors),
      module_(*module),
      istream_(module->istream),
      validator_(errors, ValidateOptions(features)) {}